

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

void Abc_SuppGenFilter(Vec_Wrd_t *p,int nBits)

{
  int iVar1;
  word Entry;
  undefined4 local_28;
  undefined4 local_24;
  int k;
  int i;
  word Ent;
  int nBits_local;
  Vec_Wrd_t *p_local;
  
  local_28 = 0;
  for (local_24 = 0; iVar1 = Vec_WrdSize(p), local_24 < iVar1; local_24 = local_24 + 1) {
    Entry = Vec_WrdEntry(p,local_24);
    if ((Entry >> ((byte)nBits & 0x3f) & 1) == 0) {
      Vec_WrdWriteEntry(p,local_28,Entry);
      local_28 = local_28 + 1;
    }
  }
  Vec_WrdShrink(p,local_28);
  return;
}

Assistant:

void Abc_SuppGenFilter( Vec_Wrd_t * p, int nBits )
{
    word Ent;
    int i, k = 0;
    Vec_WrdForEachEntry( p, Ent, i )
        if ( ((Ent >> nBits) & 1) == 0 )
            Vec_WrdWriteEntry( p, k++, Ent );
    Vec_WrdShrink( p, k );
}